

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(ScreenLogicalDotsPerInchEvent *e)

{
  bool bVar1;
  ulong uVar2;
  UpdateEmitter *this;
  QScreenPrivate *pQVar3;
  iterator o;
  QWindow **ppQVar4;
  QWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QWindow *window;
  QWindowList *__range1;
  QScreen *s;
  iterator __end1;
  iterator __begin1;
  UpdateEmitter updateEmitter;
  QWindow *rhs;
  QScreen *in_stack_ffffffffffffff50;
  QWindow *this_00;
  QScreenPrivate *in_stack_ffffffffffffff78;
  iterator local_80;
  UpdateEmitter *in_stack_ffffffffffffff88;
  pair<double,_double> local_60;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QCoreApplication::startingUp();
  if ((uVar2 & 1) == 0) {
    QHighDpiScaling::updateHighDpiScaling();
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QScreen> *)0x36a704);
    if (bVar1) {
      this = (UpdateEmitter *)QPointer<QScreen>::data((QPointer<QScreen> *)0x36a71b);
      memcpy(local_50,&DAT_00b92998,0x48);
      QScreenPrivate::UpdateEmitter::UpdateEmitter(this,in_stack_ffffffffffffff50);
      std::pair<double,_double>::pair<double_&,_double_&,_true>
                (&local_60,(double *)&in_RDI->field_0x28,(double *)&in_RDI->field_0x30);
      pQVar3 = QScreen::d_func((QScreen *)0x36a76b);
      std::pair<double,_double>::operator=(&(pQVar3->super_QScreenData).logicalDpi,&local_60);
      QScreen::d_func((QScreen *)0x36a78a);
      QScreenPrivate::updateGeometry(in_stack_ffffffffffffff78);
      QScreenPrivate::UpdateEmitter::~UpdateEmitter(in_stack_ffffffffffffff88);
      QGuiApplication::allWindows();
      this_00 = (QWindow *)&stack0xffffffffffffff88;
      local_80.i = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
      local_80 = QList<QWindow_*>::begin((QList<QWindow_*> *)this_00);
      o = QList<QWindow_*>::end((QList<QWindow_*> *)this_00);
      while (bVar1 = QList<QWindow_*>::iterator::operator!=(&local_80,o), bVar1) {
        ppQVar4 = QList<QWindow_*>::iterator::operator*(&local_80);
        rhs = *ppQVar4;
        QWindow::screen(this_00);
        bVar1 = ::operator==((QScreen **)this_00,(QPointer<QScreen> *)rhs);
        if (bVar1) {
          QWindowPrivate::get((QWindow *)0x36a85f);
          QWindowPrivate::updateDevicePixelRatio(in_RDI);
        }
        QList<QWindow_*>::iterator::operator++(&local_80);
      }
      QList<QWindow_*>::~QList((QList<QWindow_*> *)0x36a81c);
      resetCachedDevicePixelRatio();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent *e)
{
    // This operation only makes sense after the QGuiApplication constructor runs
    if (QCoreApplication::startingUp())
        return;

    QHighDpiScaling::updateHighDpiScaling();

    if (!e->screen)
        return;

    {
        QScreen *s = e->screen.data();
        QScreenPrivate::UpdateEmitter updateEmitter(s);
        s->d_func()->logicalDpi = QDpi(e->dpiX, e->dpiY);
        s->d_func()->updateGeometry();
    }

    for (QWindow *window : QGuiApplication::allWindows())
        if (window->screen() == e->screen)
            QWindowPrivate::get(window)->updateDevicePixelRatio();

    resetCachedDevicePixelRatio();
}